

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

User * __thiscall
cmCTestP4::GetUserData(User *__return_storage_ptr__,cmCTestP4 *this,string *username)

{
  bool bVar1;
  reference cmd;
  pointer ppVar2;
  iterator local_208;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  local_200;
  iterator local_1f8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  local_1f0;
  undefined1 local_1e8 [8];
  OutputLogger err;
  UserParser out;
  value_type local_88;
  char *local_80;
  char *local_78;
  char *local_70 [3];
  undefined1 local_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_users;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  local_28;
  const_iterator it;
  string *username_local;
  cmCTestP4 *this_local;
  
  it._M_node = (_Base_ptr)username;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
       ::find(&this->Users,username);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  p4_users.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
                ::end(&this->Users);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
  ::_Rb_tree_const_iterator
            (&local_38,
             (iterator *)
             &p4_users.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
    SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
    local_70[0] = "users";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,local_70);
    local_78 = "-m";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_78);
    local_80 = "1";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_80);
    local_88 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_88);
    out.P4 = (cmCTestP4 *)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,(value_type *)&out.P4
              );
    UserParser::UserParser((UserParser *)&err.super_LineParser.Separator,this,"users-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_1e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "users-err> ");
    cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,0);
    cmCTestVC::RunChild((cmCTestVC *)this,cmd,(OutputParser *)&err.super_LineParser.Separator,
                        (OutputParser *)local_1e8,(char *)0x0);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
         ::find(&this->Users,it._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
    ::_Rb_tree_const_iterator(&local_1f0,&local_1f8);
    local_28._M_node = local_1f0._M_node;
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
         ::end(&this->Users);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
    ::_Rb_tree_const_iterator(&local_200,&local_208);
    bVar1 = std::operator==(&local_28,&local_200);
    if (bVar1) {
      User::User(__return_storage_ptr__);
    }
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1e8);
    UserParser::~UserParser((UserParser *)&err.super_LineParser.Separator);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
           ::operator->(&local_28);
  User::User(__return_storage_ptr__,&ppVar2->second);
  return __return_storage_ptr__;
}

Assistant:

cmCTestP4::User cmCTestP4::GetUserData(const std::string& username)
{
  std::map<std::string, cmCTestP4::User>::const_iterator it =
          Users.find(username);

  if(it == Users.end())
    {
    std::vector<char const*> p4_users;
    SetP4Options(p4_users);
    p4_users.push_back("users");
    p4_users.push_back("-m");
    p4_users.push_back("1");
    p4_users.push_back(username.c_str());
    p4_users.push_back(0);

    UserParser out(this, "users-out> ");
    OutputLogger err(this->Log, "users-err> ");
    RunChild(&p4_users[0], &out, &err);

    // The user should now be added to the map. Search again.
    it = Users.find(username);
    if(it == Users.end())
      {
      return cmCTestP4::User();
      }
    }

  return it->second;
}